

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.cc
# Opt level: O0

void __thiscall trng::yarn4::yarn4(yarn4 *this,unsigned_long s,parameter_type P)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  unsigned_long in_RSI;
  yarn4 *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = in_RDX;
  *(undefined8 *)((in_RDI->P).a + 2) = in_RCX;
  mrg_status<int,_4,_trng::yarn4>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

yarn4::yarn4(unsigned long s, yarn4::parameter_type P) : P{P} { seed(s); }